

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YSet.cpp
# Opt level: O2

YError __thiscall
Yedis::YSet::sadd(YSet *this,
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *params,ReplyBuffer *reply)

{
  _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *this_00;
  pointer pbVar1;
  YError YVar2;
  YObject *pYVar3;
  long lVar4;
  uint uVar5;
  size_t i;
  ulong uVar6;
  __ireturn_type _Var7;
  
  pYVar3 = creatrOrGetSet(this,(params->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start + 1,reply);
  if (pYVar3 == (YObject *)0x0) {
    ReplyBuffer::pushData(reply,"-ERR error type\r\n",0xf);
    YVar2 = YError_type;
  }
  else {
    this_00 = (_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               *)pYVar3->value;
    uVar5 = 0;
    lVar4 = 0x40;
    for (uVar6 = 2;
        pbVar1 = (params->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,
        uVar6 < (ulong)((long)(params->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
        uVar6 = uVar6 + 1) {
      _Var7 = std::__detail::
              _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::insert(this_00,(value_type *)((long)&(pbVar1->_M_dataplus)._M_p + lVar4));
      uVar5 = uVar5 + (_Var7.second & 1);
      lVar4 = lVar4 + 0x20;
    }
    YedisFormate::formatInt((ulong)uVar5,reply);
    YVar2 = YError_ok;
  }
  return YVar2;
}

Assistant:

YError YSet::sadd(const std::vector<std::string>& params, ReplyBuffer* reply)
{
    YObject* value = creatrOrGetSet(params[1], reply);
    if(value == nullptr)
    {
        reply->pushData("-ERR error type\r\n", sizeof("-ERR error type") -1);
        return YError_type;
    }
    int res = 0;
    auto set = value->castSet();
    for (std::size_t i = 2; i < params.size(); ++ i)
    {
        if (set->insert(params[i]).second)
        {
            ++res;
        }
    }
    
    Yedis::YedisFormate::formatInt(res, reply);
    return YError_ok;
}